

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* coda_split_string_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,char *src,char *delimiters,bool ignore_empty)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = src;
  for (pcVar3 = src; *pcVar3 != '\0'; pcVar3 = pcVar3 + 1) {
    pcVar1 = strchr(delimiters,(int)*pcVar3);
    if (pcVar1 != (char *)0x0) {
      if (src < pcVar3 || !ignore_empty) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,src,pcVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      src = pcVar3 + 1;
    }
    pcVar2 = pcVar2 + 1;
  }
  if (src < pcVar3 || !ignore_empty) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,src,pcVar2);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> coda_split_string(const char *src, const char *delimiters, bool ignore_empty)
{
	std::vector<std::string> result;
	const char *prev_ptr = src;
	const char *p = src;

	for (; *p; ++p)
	{
		if (NULL != strchr(delimiters, *p))
		{
			if (prev_ptr < p || !ignore_empty)
			{
				result.push_back(std::string(prev_ptr, p - prev_ptr));
			}

			prev_ptr = p + 1;
		}
	}

	if (prev_ptr < p || !ignore_empty)
	{
		result.push_back(std::string(prev_ptr, p - prev_ptr));
	}

	return result;
}